

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::transform_mcu_expand(jpeg_decoder *this,int mcu_row)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  Matrix44 *d;
  Matrix44 c;
  Matrix44 *b;
  Matrix44 a;
  int max_zag;
  Matrix44 S;
  Matrix44 R;
  Matrix44 Q;
  Matrix44 P;
  int i;
  jpgd_block_t temp_block [64];
  int mcu_block;
  uint8 *pDst_ptr;
  jpgd_block_t *pSrc_ptr;
  Matrix44 *b_00;
  Matrix44 *in_stack_fffffffffffffdc8;
  Matrix44 *in_stack_fffffffffffffdd0;
  Matrix44 *in_stack_fffffffffffffdd8;
  Matrix44 *in_stack_fffffffffffffde0;
  jpgd_block_t *in_stack_fffffffffffffe20;
  Matrix44 *in_stack_fffffffffffffe28;
  Matrix44 *in_stack_fffffffffffffe30;
  Matrix44 *in_stack_fffffffffffffe38;
  Matrix44 *in_stack_fffffffffffffe40;
  Element_Type in_stack_fffffffffffffe54;
  Matrix44 *in_stack_fffffffffffffe58;
  Matrix44 *in_stack_fffffffffffffe60;
  Matrix44 *in_stack_fffffffffffffe68;
  Matrix44 *in_stack_fffffffffffffe70;
  Matrix44 *in_stack_fffffffffffffe78;
  Matrix44 *in_stack_fffffffffffffe80;
  Matrix44 *in_stack_fffffffffffffe88;
  Matrix44 *in_stack_fffffffffffffe90;
  Matrix44 *in_stack_fffffffffffffe98;
  Matrix44 *in_stack_fffffffffffffea0;
  Matrix44 *in_stack_fffffffffffffea8;
  Matrix44 *in_stack_fffffffffffffeb0;
  uint8 *in_stack_fffffffffffffec8;
  jpgd_block_t *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffef4;
  uint8 *in_stack_fffffffffffffef8;
  jpgd_block_t *in_stack_ffffffffffffff00;
  Matrix44 local_ec;
  int local_ac;
  int local_24;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_RDI + 0x2500);
  local_20 = *(long *)(in_RDI + 0x2530) + (long)(in_ESI * *(int *)(in_RDI + 0x24d8) * 0x40);
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x24e0); local_24 = local_24 + 1) {
    jpgd::idct(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    local_18 = local_18 + 0x80;
    local_20 = local_20 + 0x40;
  }
  for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
    DCT_Upsample::Matrix44::Matrix44(&local_ec);
    DCT_Upsample::Matrix44::Matrix44((Matrix44 *)&stack0xfffffffffffffed4);
    DCT_Upsample::Matrix44::Matrix44((Matrix44 *)&stack0xfffffffffffffe94);
    DCT_Upsample::Matrix44::Matrix44((Matrix44 *)&stack0xfffffffffffffe54);
    iVar2 = local_24 + 1;
    iVar1 = *(int *)(in_RDI + 0x2508 + (long)local_24 * 4) + -1;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    local_24 = iVar2;
    switch(s_max_rc[iVar1]) {
    case 0x11:
      DCT_Upsample::P_Q<1,_1>::calc
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (jpgd_block_t *)in_stack_fffffffffffffe30);
      DCT_Upsample::R_S<1,_1>::calc
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      break;
    case 0x12:
      DCT_Upsample::P_Q<1,_2>::calc
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (jpgd_block_t *)in_stack_fffffffffffffe30);
      DCT_Upsample::R_S<1,_2>::calc
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (jpgd_block_t *)in_stack_fffffffffffffe30);
      break;
    default:
      break;
    case 0x22:
      DCT_Upsample::P_Q<2,_2>::calc
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (jpgd_block_t *)in_stack_fffffffffffffe60);
      DCT_Upsample::R_S<2,_2>::calc
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (jpgd_block_t *)CONCAT44(in_stack_fffffffffffffe54,iVar1));
      break;
    case 0x32:
      DCT_Upsample::P_Q<3,_2>::calc
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (jpgd_block_t *)in_stack_fffffffffffffe70);
      DCT_Upsample::R_S<3,_2>::calc
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (jpgd_block_t *)CONCAT44(in_stack_fffffffffffffe54,iVar1));
      break;
    case 0x33:
      DCT_Upsample::P_Q<3,_3>::calc
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (jpgd_block_t *)in_stack_fffffffffffffe70);
      DCT_Upsample::R_S<3,_3>::calc
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (jpgd_block_t *)in_stack_fffffffffffffe70);
      break;
    case 0x34:
      DCT_Upsample::P_Q<3,_4>::calc
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (jpgd_block_t *)in_stack_fffffffffffffe70);
      DCT_Upsample::R_S<3,_4>::calc
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (jpgd_block_t *)in_stack_fffffffffffffe70);
      break;
    case 0x44:
      DCT_Upsample::P_Q<4,_4>::calc
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (jpgd_block_t *)in_stack_fffffffffffffe70);
      DCT_Upsample::R_S<4,_4>::calc
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (jpgd_block_t *)in_stack_fffffffffffffe70);
      break;
    case 0x54:
      DCT_Upsample::P_Q<5,_4>::calc
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (jpgd_block_t *)in_stack_fffffffffffffe80);
      DCT_Upsample::R_S<5,_4>::calc
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (jpgd_block_t *)in_stack_fffffffffffffe80);
      break;
    case 0x55:
      DCT_Upsample::P_Q<5,_5>::calc
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (jpgd_block_t *)in_stack_fffffffffffffe90);
      DCT_Upsample::R_S<5,_5>::calc
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (jpgd_block_t *)in_stack_fffffffffffffe80);
      break;
    case 0x56:
      DCT_Upsample::P_Q<5,_6>::calc
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (jpgd_block_t *)in_stack_fffffffffffffe90);
      DCT_Upsample::R_S<5,_6>::calc
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (jpgd_block_t *)in_stack_fffffffffffffe80);
      break;
    case 0x66:
      DCT_Upsample::P_Q<6,_6>::calc
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (jpgd_block_t *)in_stack_fffffffffffffe90);
      DCT_Upsample::R_S<6,_6>::calc
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (jpgd_block_t *)in_stack_fffffffffffffe80);
      break;
    case 0x76:
      DCT_Upsample::P_Q<7,_6>::calc
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (jpgd_block_t *)in_stack_fffffffffffffea0);
      DCT_Upsample::R_S<7,_6>::calc
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (jpgd_block_t *)in_stack_fffffffffffffe80);
      break;
    case 0x77:
      DCT_Upsample::P_Q<7,_7>::calc
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (jpgd_block_t *)in_stack_fffffffffffffea0);
      DCT_Upsample::R_S<7,_7>::calc
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (jpgd_block_t *)in_stack_fffffffffffffea0);
      break;
    case 0x78:
      DCT_Upsample::P_Q<7,_8>::calc
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (jpgd_block_t *)in_stack_fffffffffffffea0);
      DCT_Upsample::R_S<7,_8>::calc
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (jpgd_block_t *)in_stack_fffffffffffffea0);
      break;
    case 0x88:
      DCT_Upsample::P_Q<8,_8>::calc
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (jpgd_block_t *)in_stack_fffffffffffffea0);
      DCT_Upsample::R_S<8,_8>::calc
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (jpgd_block_t *)in_stack_fffffffffffffea0);
    }
    DCT_Upsample::operator+(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    DCT_Upsample::Matrix44::operator-=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    DCT_Upsample::operator+(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    DCT_Upsample::Matrix44::operator-=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    b_00 = (Matrix44 *)&stack0xfffffffffffffe94;
    DCT_Upsample::Matrix44::add_and_store
              ((jpgd_block_t *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,b_00);
    idct_4x4(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_20 = local_20 + 0x40;
    DCT_Upsample::Matrix44::sub_and_store
              ((jpgd_block_t *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,b_00);
    idct_4x4(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_20 = local_20 + 0x40;
    DCT_Upsample::Matrix44::add_and_store
              ((jpgd_block_t *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,b_00);
    idct_4x4(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_20 = local_20 + 0x40;
    DCT_Upsample::Matrix44::sub_and_store
              ((jpgd_block_t *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,b_00);
    idct_4x4(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_20 = local_20 + 0x40;
    local_18 = local_18 + 0x80;
  }
  return;
}

Assistant:

void jpeg_decoder::transform_mcu_expand(int mcu_row) {
  jpgd_block_t* pSrc_ptr = m_pMCU_coefficients;
  uint8* pDst_ptr = m_pSample_buf + mcu_row * m_expanded_blocks_per_mcu * 64;

  // Y IDCT
  int mcu_block;
  for (mcu_block = 0; mcu_block < m_expanded_blocks_per_component; mcu_block++) {
    idct(pSrc_ptr, pDst_ptr, m_mcu_block_max_zag[mcu_block]);
    pSrc_ptr += 64;
    pDst_ptr += 64;
  }

  // Chroma IDCT, with upsampling
  jpgd_block_t temp_block[64];

  for (int i = 0; i < 2; i++) {
    DCT_Upsample::Matrix44 P, Q, R, S;

    JPGD_ASSERT(m_mcu_block_max_zag[mcu_block] >= 1);
    JPGD_ASSERT(m_mcu_block_max_zag[mcu_block] <= 64);

    int max_zag = m_mcu_block_max_zag[mcu_block++] - 1;
    if (max_zag <= 0)
      max_zag = 0;  // should never happen, only here to shut up static analysis
    switch (s_max_rc[max_zag]) {
      case 1 * 16 + 1:
        DCT_Upsample::P_Q<1, 1>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<1, 1>::calc(R, S, pSrc_ptr);
        break;
      case 1 * 16 + 2:
        DCT_Upsample::P_Q<1, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<1, 2>::calc(R, S, pSrc_ptr);
        break;
      case 2 * 16 + 2:
        DCT_Upsample::P_Q<2, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<2, 2>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 2:
        DCT_Upsample::P_Q<3, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 2>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 3:
        DCT_Upsample::P_Q<3, 3>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 3>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 4:
        DCT_Upsample::P_Q<3, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 4>::calc(R, S, pSrc_ptr);
        break;
      case 4 * 16 + 4:
        DCT_Upsample::P_Q<4, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<4, 4>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 4:
        DCT_Upsample::P_Q<5, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 4>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 5:
        DCT_Upsample::P_Q<5, 5>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 5>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 6:
        DCT_Upsample::P_Q<5, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 6>::calc(R, S, pSrc_ptr);
        break;
      case 6 * 16 + 6:
        DCT_Upsample::P_Q<6, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<6, 6>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 6:
        DCT_Upsample::P_Q<7, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 6>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 7:
        DCT_Upsample::P_Q<7, 7>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 7>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 8:
        DCT_Upsample::P_Q<7, 8>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 8>::calc(R, S, pSrc_ptr);
        break;
      case 8 * 16 + 8:
        DCT_Upsample::P_Q<8, 8>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<8, 8>::calc(R, S, pSrc_ptr);
        break;
      default:
        JPGD_ASSERT(false);
    }

    DCT_Upsample::Matrix44 a(P + Q);
    P -= Q;
    DCT_Upsample::Matrix44& b = P;
    DCT_Upsample::Matrix44 c(R + S);
    R -= S;
    DCT_Upsample::Matrix44& d = R;

    DCT_Upsample::Matrix44::add_and_store(temp_block, a, c);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::sub_and_store(temp_block, a, c);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::add_and_store(temp_block, b, d);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::sub_and_store(temp_block, b, d);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    pSrc_ptr += 64;
  }
}